

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O0

void xmrig::cryptonight_triple_hash<false>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  ulong uVar1;
  ulong uVar2;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx0_01;
  __m128i bx1;
  __m128i bx1_00;
  __m128i bx1_01;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t uVar8;
  uint uVar9;
  uint64_t *mem_out;
  uint64_t *mem_out_00;
  ulong *puVar10;
  ulong b;
  ulong uVar11;
  ulong uVar12;
  long *in_RCX;
  long in_RDX;
  longlong in_R8;
  __m128i *in_R9;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i ax0_00;
  __m128i ax0_01;
  __m128i ax0_02;
  size_t i_2;
  __m128i chunk3_2;
  __m128i chunk2_2;
  __m128i chunk1_2;
  uint64_t division_result_2;
  uint64_t cx_1_2;
  uint32_t d_2;
  uint64_t cx_0_2;
  uint64_t sqrt_result_2;
  __m128i chunk3_1;
  __m128i chunk2_1;
  __m128i chunk1_1;
  uint64_t division_result_1;
  uint64_t cx_1_1;
  uint32_t d_1;
  uint64_t cx_0_1;
  uint64_t sqrt_result_1;
  __m128i chunk3;
  __m128i chunk2;
  __m128i chunk1;
  uint64_t division_result;
  uint64_t cx_1;
  uint32_t d;
  uint64_t cx_0;
  uint64_t sqrt_result;
  uint64_t ch2;
  uint64_t cl2;
  uint64_t ch1;
  uint64_t cl1;
  uint64_t ch0;
  uint64_t cl0;
  __m128i *ptr2;
  __m128i *ptr1;
  __m128i *ptr0;
  uint64_t lo;
  uint64_t hi;
  size_t i_1;
  uint64_t idx2;
  uint64_t idx1;
  uint64_t idx0;
  __m128i cx2;
  __m128i bx21;
  __m128i bx20;
  __m128i ax2;
  __m128i sqrt_result_xmm_2;
  __m128i division_result_xmm_2;
  __m128i cx1;
  __m128i bx11;
  __m128i bx10;
  __m128i ax1;
  __m128i sqrt_result_xmm_1;
  __m128i division_result_xmm_1;
  __m128i cx0;
  __m128i bx01;
  __m128i bx00;
  __m128i ax0;
  __m128i sqrt_result_xmm_0;
  __m128i division_result_xmm_0;
  uint64_t *h2;
  uint64_t *h1;
  uint64_t *h0;
  uint8_t *l2;
  uint8_t *l1;
  uint8_t *l0;
  size_t i;
  uint32_t iters;
  size_t MASK;
  size_t in_stack_fffffffffffff358;
  uint8_t *in_stack_fffffffffffff360;
  ulong uVar13;
  long in_stack_fffffffffffff368;
  long in_stack_fffffffffffff370;
  int local_c48;
  int local_c40;
  int local_be8;
  int local_be0;
  int local_b88;
  __m128i *in_stack_fffffffffffff4b0;
  __m128i *in_stack_fffffffffffff4b8;
  ulong local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  undefined1 local_b08 [16];
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  ulong local_ad8;
  ulong uStack_ad0;
  ulong local_ac8;
  undefined8 uStack_ac0;
  ulong local_ab8;
  undefined8 uStack_ab0;
  undefined1 local_aa8 [16];
  ulong local_a98;
  ulong uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  undefined8 uStack_a50;
  undefined1 local_a48 [16];
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  ulong local_a08;
  undefined8 uStack_a00;
  ulong local_9f8;
  undefined8 uStack_9f0;
  ulong *local_9e0;
  ulong *local_9d8;
  ulong *local_9d0;
  uint8_t *local_9c8;
  uint8_t *local_9c0;
  uint8_t *local_9b8;
  ulong local_9b0;
  uint local_9a4;
  undefined8 local_9a0;
  __m128i *local_998;
  long *local_988;
  long local_980;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  uint64_t uStack_940;
  ulong local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  uint64_t uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  uint64_t uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  undefined8 uStack_8a0;
  ulong local_890;
  ulong local_888;
  undefined8 uStack_880;
  ulong local_870;
  ulong local_868;
  undefined8 uStack_860;
  ulong local_850;
  ulong local_848;
  undefined8 uStack_840;
  ulong local_830;
  ulong local_828;
  undefined8 uStack_820;
  ulong local_810;
  ulong local_808;
  undefined8 uStack_800;
  ulong local_7f0;
  ulong local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d0;
  ulong local_7c8;
  undefined8 uStack_7c0;
  ulong local_7b0;
  ulong local_7a8;
  undefined8 uStack_7a0;
  ulong local_790;
  ulong local_788;
  ulong uStack_780;
  ulong local_778;
  ulong local_770;
  ulong local_768;
  ulong uStack_760;
  ulong local_758;
  ulong local_750;
  ulong local_748;
  uint64_t uStack_740;
  ulong local_738;
  uint64_t local_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong local_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  uint64_t uStack_6e0;
  ulong local_6d8;
  uint64_t local_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_698;
  ulong local_690;
  ulong local_688;
  uint64_t uStack_680;
  ulong local_678;
  uint64_t local_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_658;
  ulong local_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong local_630;
  ulong local_628;
  ulong uStack_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  ulong uStack_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  ulong uStack_560;
  ulong local_558;
  ulong local_550;
  long *local_548;
  long *local_540;
  ulong *local_538;
  long *local_530;
  long *local_528;
  ulong *local_520;
  long *local_518;
  long *local_510;
  ulong *local_508;
  uint64_t *local_500;
  uint64_t *local_4f8;
  undefined1 (*local_4f0) [16];
  ulong local_4e8;
  ulong uStack_4e0;
  uint64_t local_4d8;
  uint64_t uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  uint64_t local_4b8;
  uint64_t uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  undefined8 uStack_470;
  ulong local_468;
  undefined8 uStack_460;
  long local_458;
  ulong uStack_450;
  ulong local_448;
  undefined8 uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  long local_408;
  ulong uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  undefined8 uStack_3c0;
  uint64_t local_3b8;
  ulong uStack_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  undefined8 uStack_390;
  uint64_t local_388;
  undefined8 uStack_380;
  uint64_t local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  __m128i *local_320;
  long local_318;
  long lStack_310;
  long *local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  __m128i *local_2a0;
  long local_298;
  long lStack_290;
  long *local_280;
  long local_278;
  long lStack_270;
  long *local_260;
  long local_258;
  long lStack_250;
  long *local_240;
  ulong local_238;
  ulong uStack_230;
  ulong *local_220;
  long local_218;
  long lStack_210;
  long *local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  long local_188;
  long lStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  long local_148;
  long lStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  long local_108;
  long lStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  long local_c8;
  long lStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  long local_88;
  long lStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  long local_48;
  long lStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_9a0 = 0xffff0;
  local_998 = in_R9;
  local_988 = in_RCX;
  local_980 = in_RDX;
  uVar8 = CnAlgo::iterations((CnAlgo *)
                             &cryptonight_triple_hash<false>(unsigned_char_const*,unsigned_long,unsigned_char*,cryptonight_ctx**,unsigned_long,unsigned_long)
                              ::props);
  local_9a4 = (uint)((long)*local_998 + (ulong)uVar8 >> 1);
  for (local_9b0 = 0; local_9b0 < 3; local_9b0 = local_9b0 + 1) {
    keccak(in_stack_fffffffffffff360,in_stack_fffffffffffff358,(uint8_t *)0x2624bb);
    cn_explode_scratchpad<false>(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
  }
  local_9b8 = *(uint8_t **)(*local_988 + 0xe0);
  local_9c0 = *(uint8_t **)(local_988[1] + 0xe0);
  local_9c8 = *(uint8_t **)(local_988[2] + 0xe0);
  local_9d0 = (ulong *)*local_988;
  local_9d8 = (ulong *)local_988[1];
  local_9e0 = (ulong *)local_988[2];
  local_9f8 = local_9d0[0xc];
  uStack_7a0 = 0;
  uStack_9f0 = 0;
  local_a08 = local_9d0[0xd];
  uStack_7c0 = 0;
  uStack_a00 = 0;
  uStack_a10 = local_9d0[1] ^ local_9d0[5];
  local_a18 = *local_9d0 ^ local_9d0[4];
  uStack_a20 = local_9d0[3] ^ local_9d0[7];
  local_a28 = local_9d0[2] ^ local_9d0[6];
  uStack_a30 = local_9d0[9] ^ local_9d0[0xb];
  local_a38 = local_9d0[8] ^ local_9d0[10];
  local_18 = 0;
  uStack_10 = 0;
  local_a48 = ZEXT816(0);
  local_a58 = local_9d8[0xc];
  uStack_7e0 = 0;
  uStack_a50 = 0;
  local_a68 = local_9d8[0xd];
  uStack_800 = 0;
  uStack_a60 = 0;
  uStack_a70 = local_9d8[1] ^ local_9d8[5];
  local_a78 = *local_9d8 ^ local_9d8[4];
  uStack_a80 = local_9d8[3] ^ local_9d8[7];
  local_a88 = local_9d8[2] ^ local_9d8[6];
  uStack_a90 = local_9d8[9] ^ local_9d8[0xb];
  local_a98 = local_9d8[8] ^ local_9d8[10];
  local_28 = 0;
  uStack_20 = 0;
  local_aa8 = ZEXT816(0);
  local_ab8 = local_9e0[0xc];
  uStack_820 = 0;
  uStack_ab0 = 0;
  local_ac8 = local_9e0[0xd];
  uStack_840 = 0;
  uStack_ac0 = 0;
  uStack_ad0 = local_9e0[1] ^ local_9e0[5];
  local_ad8 = *local_9e0 ^ local_9e0[4];
  uStack_ae0 = local_9e0[3] ^ local_9e0[7];
  local_ae8 = local_9e0[2] ^ local_9e0[6];
  uStack_af0 = local_9e0[9] ^ local_9e0[0xb];
  local_af8 = local_9e0[8] ^ local_9e0[10];
  local_38 = 0;
  uStack_30 = 0;
  local_b08 = ZEXT816(0);
  local_848 = local_ac8;
  local_830 = local_ac8;
  local_828 = local_ab8;
  local_810 = local_ab8;
  local_808 = local_a68;
  local_7f0 = local_a68;
  local_7e8 = local_a58;
  local_7d0 = local_a58;
  local_7c8 = local_a08;
  local_7b0 = local_a08;
  local_7a8 = local_9f8;
  local_790 = local_9f8;
  local_668 = local_af8;
  uStack_660 = uStack_af0;
  local_658 = local_af8;
  local_650 = uStack_af0;
  local_648 = local_ae8;
  uStack_640 = uStack_ae0;
  local_638 = local_ae8;
  local_630 = uStack_ae0;
  local_628 = local_ad8;
  uStack_620 = uStack_ad0;
  local_618 = local_ad8;
  local_610 = uStack_ad0;
  local_608 = local_a98;
  uStack_600 = uStack_a90;
  local_5f8 = local_a98;
  local_5f0 = uStack_a90;
  local_5e8 = local_a88;
  uStack_5e0 = uStack_a80;
  local_5d8 = local_a88;
  local_5d0 = uStack_a80;
  local_5c8 = local_a78;
  uStack_5c0 = uStack_a70;
  local_5b8 = local_a78;
  local_5b0 = uStack_a70;
  local_5a8 = local_a38;
  uStack_5a0 = uStack_a30;
  local_598 = local_a38;
  local_590 = uStack_a30;
  local_588 = local_a28;
  uStack_580 = uStack_a20;
  local_578 = local_a28;
  local_570 = uStack_a20;
  local_568 = local_a18;
  uStack_560 = uStack_a10;
  local_558 = local_a18;
  local_550 = uStack_a10;
  fesetround(0x400);
  local_348 = local_a18;
  uStack_340 = uStack_a10;
  local_b10 = local_a18;
  local_358 = local_a78;
  uStack_350 = uStack_a70;
  local_b18 = local_a78;
  local_368 = local_ad8;
  uStack_360 = uStack_ad0;
  for (local_b28 = 0; local_b20 = local_ad8, local_b28 < local_9a4; local_b28 = local_b28 + 1) {
    local_4f0 = (undefined1 (*) [16])(local_9b8 + ((uint)local_b10 & 0xffff0));
    local_498 = *(undefined8 *)*local_4f0;
    uStack_490 = *(undefined8 *)(*local_4f0 + 8);
    mem_out = (uint64_t *)(local_9c0 + ((uint)local_b18 & 0xffff0));
    local_aa8._0_8_ = *mem_out;
    local_aa8._8_8_ = mem_out[1];
    mem_out_00 = (uint64_t *)(local_9c8 + ((uint)local_ad8 & 0xffff0));
    local_b08._0_8_ = *mem_out_00;
    local_b08._8_8_ = mem_out_00[1];
    local_4a8 = local_a18;
    uStack_4a0 = uStack_a10;
    auVar7._8_8_ = uStack_a10;
    auVar7._0_8_ = local_a18;
    local_a48 = aesenc(*local_4f0,auVar7);
    bx0[1] = (longlong)in_stack_fffffffffffff360;
    bx0[0] = in_stack_fffffffffffff358;
    bx1[1] = in_stack_fffffffffffff370;
    bx1[0] = in_stack_fffffffffffff368;
    ax0_00[1] = in_R8;
    ax0_00[0] = (longlong)local_a48;
    local_500 = mem_out_00;
    local_4f8 = mem_out;
    cryptonight_monero_tweak
              ((uint64_t *)local_4f0,local_9b8,(ulong)((uint)local_b10 & 0xffff0),ax0_00,bx0,bx1,
               in_R9);
    local_4b8 = local_aa8._0_8_;
    uStack_4b0 = local_aa8._8_8_;
    local_4c8 = local_a78;
    uStack_4c0 = uStack_a70;
    auVar6._8_8_ = local_aa8._8_8_;
    auVar6._0_8_ = local_aa8._0_8_;
    auVar5._8_8_ = uStack_a70;
    auVar5._0_8_ = local_a78;
    local_aa8 = aesenc(auVar6,auVar5);
    bx0_00[1] = (longlong)in_stack_fffffffffffff360;
    bx0_00[0] = in_stack_fffffffffffff358;
    bx1_00[1] = in_stack_fffffffffffff370;
    bx1_00[0] = in_stack_fffffffffffff368;
    ax0_01[1] = in_R8;
    ax0_01[0] = (longlong)local_aa8;
    cryptonight_monero_tweak
              (mem_out,local_9c0,(ulong)((uint)local_b18 & 0xffff0),ax0_01,bx0_00,bx1_00,in_R9);
    local_4d8 = local_b08._0_8_;
    uStack_4d0 = local_b08._8_8_;
    local_4e8 = local_ad8;
    uStack_4e0 = uStack_ad0;
    auVar4._8_8_ = local_b08._8_8_;
    auVar4._0_8_ = local_b08._0_8_;
    auVar3._8_8_ = uStack_ad0;
    auVar3._0_8_ = local_ad8;
    local_b08 = aesenc(auVar4,auVar3);
    bx0_01[1] = (longlong)in_stack_fffffffffffff360;
    bx0_01[0] = in_stack_fffffffffffff358;
    bx1_01[1] = in_stack_fffffffffffff370;
    bx1_01[0] = in_stack_fffffffffffff368;
    ax0_02[1] = in_R8;
    ax0_02[0] = (longlong)local_b08;
    cryptonight_monero_tweak
              (mem_out_00,local_9c8,(ulong)((uint)local_b20 & 0xffff0),ax0_02,bx0_01,bx1_01,in_R9);
    local_378 = local_a48._0_8_;
    uStack_370 = local_a48._8_8_;
    local_b10 = local_a48._0_8_;
    puVar10 = (ulong *)(local_9b8 + (local_a48._0_4_ & 0xffff0));
    uVar13 = puVar10[1];
    local_388 = local_aa8._0_8_;
    uStack_380 = local_aa8._8_8_;
    local_b18 = local_aa8._0_8_;
    in_stack_fffffffffffff4b8 = (__m128i *)(local_9c0 + (local_aa8._0_4_ & 0xffff0));
    uVar11 = (*in_stack_fffffffffffff4b8)[0];
    uVar1 = (*in_stack_fffffffffffff4b8)[1];
    local_398 = local_b08._0_8_;
    uStack_390 = local_b08._8_8_;
    local_b20 = local_b08._0_8_;
    in_stack_fffffffffffff4b0 = (__m128i *)(local_9c8 + (local_b08._0_8_ & 0xffff0));
    uVar12 = (*in_stack_fffffffffffff4b0)[0];
    uVar2 = (*in_stack_fffffffffffff4b0)[1];
    local_3a8 = local_a08;
    uStack_3a0 = uStack_a00;
    local_3b8 = local_a48._0_8_;
    uStack_3b0 = local_a48._8_8_;
    local_3c8 = local_9f8;
    uStack_3c0 = uStack_9f0;
    b = *puVar10 ^ local_9f8 ^ local_a08 << 0x20;
    local_b88 = (int)local_a08;
    uVar9 = local_a48._0_4_ + local_b88 * 2 | 0x80000001;
    local_3d8 = local_a48._8_8_;
    uStack_3d0 = 0;
    local_9f8 = (ulong)local_a48._8_8_ / (ulong)uVar9 & 0xffffffff |
                (ulong)local_a48._8_8_ % (ulong)uVar9 << 0x20;
    uStack_860 = 0;
    uStack_9f0 = 0;
    local_868 = local_9f8;
    local_850 = local_9f8;
    int_sqrt_v2(local_a48._0_8_ + local_9f8);
    local_a08 = extraout_XMM0_Qa;
    uStack_a00 = extraout_XMM0_Qb;
    uStack_8c0 = __umul128(local_b10,b,&local_b30);
    local_508 = (ulong *)(local_9b8 + ((ulong)((uint)local_b10 & 0xffff0) ^ 0x10));
    local_8b8 = *local_508;
    uStack_8b0 = local_508[1];
    local_678 = local_b30;
    local_688 = local_b30;
    local_8c8 = local_b30;
    local_68 = local_8b8 ^ local_b30;
    uStack_60 = uStack_8b0 ^ uStack_8c0;
    local_510 = (long *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x20));
    local_88 = *local_510;
    lStack_80 = local_510[1];
    local_b30 = *(ulong *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x20)) ^ local_b30;
    uStack_6a0 = *(ulong *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x20) + 8) ^ uStack_8c0;
    local_518 = (long *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x30));
    local_48 = *local_518;
    lStack_40 = local_518[1];
    local_1c0 = (long *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x10));
    local_58 = local_a38;
    uStack_50 = uStack_a30;
    local_1d8 = local_48 + local_a38;
    lStack_1d0 = lStack_40 + uStack_a30;
    *local_1c0 = local_1d8;
    local_1c0[1] = lStack_1d0;
    local_1e0 = (long *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x20));
    local_78 = local_a28;
    uStack_70 = uStack_a20;
    local_1f8 = local_68 + local_a28;
    lStack_1f0 = uStack_60 + uStack_a20;
    *local_1e0 = local_1f8;
    local_1e0[1] = lStack_1f0;
    local_200 = (long *)(local_9b8 + (local_b10 & 0xffff0 ^ 0x30));
    local_98 = local_a18;
    uStack_90 = uStack_a10;
    local_218 = local_88 + local_a18;
    lStack_210 = lStack_80 + uStack_a10;
    *local_200 = local_218;
    local_200[1] = lStack_210;
    local_a8 = local_a18;
    uStack_a0 = uStack_a10;
    local_8d8 = local_a18 + local_b30;
    uStack_8d0 = uStack_a10 + uStack_6a0;
    *puVar10 = local_8d8;
    puVar10[1] = uStack_8d0;
    local_b10 = local_8d8 ^ b;
    uStack_a10 = uStack_8d0 ^ uVar13;
    local_a38 = local_a28;
    uStack_a30 = uStack_a20;
    local_a28 = local_a48._0_8_;
    uStack_a20 = local_a48._8_8_;
    local_3f8 = local_a68;
    uStack_3f0 = uStack_a60;
    local_408 = local_aa8._0_8_;
    uStack_400 = local_aa8._8_8_;
    local_418 = local_a58;
    uStack_410 = uStack_a50;
    uVar11 = uVar11 ^ local_a58 ^ local_a68 << 0x20;
    local_be8 = local_aa8._0_4_;
    local_be0 = (int)local_a68;
    uVar9 = local_be8 + local_be0 * 2 | 0x80000001;
    local_428 = local_aa8._8_8_;
    uStack_420 = 0;
    local_a58 = (ulong)local_aa8._8_8_ / (ulong)uVar9 & 0xffffffff |
                (ulong)local_aa8._8_8_ % (ulong)uVar9 << 0x20;
    uStack_880 = 0;
    uStack_a50 = 0;
    local_a18 = local_b10;
    local_8e8 = b;
    uStack_8e0 = uVar13;
    local_888 = local_a58;
    local_870 = local_a58;
    local_6c8 = b;
    uStack_6c0 = uVar13;
    local_6b8 = b;
    local_6b0 = uVar13;
    local_6a8 = local_b30;
    local_698 = local_b30;
    local_690 = uStack_6a0;
    uStack_680 = uStack_8c0;
    local_670 = uStack_8c0;
    local_3e8 = local_b10;
    uStack_3e0 = uStack_a10;
    local_238 = local_8d8;
    uStack_230 = uStack_8d0;
    local_220 = puVar10;
    local_b8 = local_b30;
    uStack_b0 = uStack_6a0;
    int_sqrt_v2(local_aa8._0_8_ + local_a58);
    local_a68 = extraout_XMM0_Qa_00;
    uStack_a60 = extraout_XMM0_Qb_00;
    uStack_900 = __umul128(local_b18,uVar11,&local_b30);
    local_520 = (ulong *)(local_9c0 + ((ulong)((uint)local_b18 & 0xffff0) ^ 0x10));
    local_8f8 = *local_520;
    uStack_8f0 = local_520[1];
    local_6d8 = local_b30;
    local_6e8 = local_b30;
    local_908 = local_b30;
    local_e8 = local_8f8 ^ local_b30;
    uStack_e0 = uStack_8f0 ^ uStack_900;
    local_528 = (long *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x20));
    local_108 = *local_528;
    lStack_100 = local_528[1];
    local_b30 = *(ulong *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x20)) ^ local_b30;
    uStack_700 = *(ulong *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x20) + 8) ^ uStack_900;
    local_530 = (long *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x30));
    local_c8 = *local_530;
    lStack_c0 = local_530[1];
    local_240 = (long *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x10));
    local_d8 = local_a98;
    uStack_d0 = uStack_a90;
    local_258 = local_c8 + local_a98;
    lStack_250 = lStack_c0 + uStack_a90;
    *local_240 = local_258;
    local_240[1] = lStack_250;
    local_260 = (long *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x20));
    local_f8 = local_a88;
    uStack_f0 = uStack_a80;
    local_278 = local_e8 + local_a88;
    lStack_270 = uStack_e0 + uStack_a80;
    *local_260 = local_278;
    local_260[1] = lStack_270;
    local_280 = (long *)(local_9c0 + (local_b18 & 0xffff0 ^ 0x30));
    local_118 = local_a78;
    uStack_110 = uStack_a70;
    local_298 = local_108 + local_a78;
    lStack_290 = lStack_100 + uStack_a70;
    *local_280 = local_298;
    local_280[1] = lStack_290;
    local_128 = local_a78;
    uStack_120 = uStack_a70;
    local_918 = local_a78 + local_b30;
    uStack_910 = uStack_a70 + uStack_700;
    (*in_stack_fffffffffffff4b8)[0] = local_918;
    (*in_stack_fffffffffffff4b8)[1] = uStack_910;
    local_b18 = local_918 ^ uVar11;
    uStack_a70 = uStack_910 ^ uVar1;
    local_a98 = local_a88;
    uStack_a90 = uStack_a80;
    local_a88 = local_aa8._0_8_;
    uStack_a80 = local_aa8._8_8_;
    local_448 = local_ac8;
    uStack_440 = uStack_ac0;
    local_458 = local_b08._0_8_;
    uStack_450 = local_b08._8_8_;
    local_468 = local_ab8;
    uStack_460 = uStack_ab0;
    uVar12 = uVar12 ^ local_ab8 ^ local_ac8 << 0x20;
    local_c48 = local_b08._0_4_;
    local_c40 = (int)local_ac8;
    uVar9 = local_c48 + local_c40 * 2 | 0x80000001;
    local_478 = local_b08._8_8_;
    uStack_470 = 0;
    local_ab8 = (ulong)local_b08._8_8_ / (ulong)uVar9 & 0xffffffff |
                (ulong)local_b08._8_8_ % (ulong)uVar9 << 0x20;
    uStack_8a0 = 0;
    uStack_ab0 = 0;
    local_a78 = local_b18;
    local_928 = uVar11;
    uStack_920 = uVar1;
    local_8a8 = local_ab8;
    local_890 = local_ab8;
    local_728 = uVar11;
    uStack_720 = uVar1;
    local_718 = uVar11;
    local_710 = uVar1;
    local_708 = local_b30;
    local_6f8 = local_b30;
    local_6f0 = uStack_700;
    uStack_6e0 = uStack_900;
    local_6d0 = uStack_900;
    local_438 = local_b18;
    uStack_430 = uStack_a70;
    local_2b8 = local_918;
    uStack_2b0 = uStack_910;
    local_2a0 = in_stack_fffffffffffff4b8;
    local_138 = local_b30;
    uStack_130 = uStack_700;
    int_sqrt_v2(local_b08._0_8_ + local_ab8);
    local_ac8 = extraout_XMM0_Qa_01;
    uStack_ac0 = extraout_XMM0_Qb_01;
    uStack_940 = __umul128(local_b20,uVar12,&local_b30);
    local_538 = (ulong *)(local_9c8 + ((ulong)((uint)local_b20 & 0xffff0) ^ 0x10));
    local_938 = *local_538;
    uStack_930 = local_538[1];
    local_738 = local_b30;
    local_748 = local_b30;
    local_948 = local_b30;
    local_168 = local_938 ^ local_b30;
    uStack_160 = uStack_930 ^ uStack_940;
    local_540 = (long *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x20));
    local_188 = *local_540;
    lStack_180 = local_540[1];
    local_b30 = *(ulong *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x20)) ^ local_b30;
    uStack_760 = *(ulong *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x20) + 8) ^ uStack_940;
    local_548 = (long *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x30));
    in_stack_fffffffffffff368 = *local_548;
    in_stack_fffffffffffff370 = local_548[1];
    local_2c0 = (long *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x10));
    local_158 = local_af8;
    uStack_150 = uStack_af0;
    local_2d8 = in_stack_fffffffffffff368 + local_af8;
    lStack_2d0 = in_stack_fffffffffffff370 + uStack_af0;
    *local_2c0 = local_2d8;
    local_2c0[1] = lStack_2d0;
    local_2e0 = (long *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x20));
    local_178 = local_ae8;
    uStack_170 = uStack_ae0;
    local_2f8 = local_168 + local_ae8;
    lStack_2f0 = uStack_160 + uStack_ae0;
    *local_2e0 = local_2f8;
    local_2e0[1] = lStack_2f0;
    local_300 = (long *)(local_9c8 + (local_b20 & 0xffff0 ^ 0x30));
    local_198 = local_ad8;
    uStack_190 = uStack_ad0;
    local_318 = local_188 + local_ad8;
    lStack_310 = lStack_180 + uStack_ad0;
    *local_300 = local_318;
    local_300[1] = lStack_310;
    local_1a8 = local_ad8;
    uStack_1a0 = uStack_ad0;
    local_958 = local_ad8 + local_b30;
    uStack_950 = uStack_ad0 + uStack_760;
    (*in_stack_fffffffffffff4b0)[0] = local_958;
    (*in_stack_fffffffffffff4b0)[1] = uStack_950;
    local_ad8 = local_958 ^ uVar12;
    uStack_ad0 = uStack_950 ^ uVar2;
    local_af8 = local_ae8;
    uStack_af0 = uStack_ae0;
    local_ae8 = local_b08._0_8_;
    uStack_ae0 = local_b08._8_8_;
    local_968 = uVar12;
    uStack_960 = uVar2;
    local_788 = uVar12;
    uStack_780 = uVar2;
    local_778 = uVar12;
    local_770 = uVar2;
    local_768 = local_b30;
    local_758 = local_b30;
    local_750 = uStack_760;
    uStack_740 = uStack_940;
    local_730 = uStack_940;
    local_488 = local_ad8;
    uStack_480 = uStack_ad0;
    local_338 = local_958;
    uStack_330 = uStack_950;
    local_320 = in_stack_fffffffffffff4b0;
    local_1b8 = local_b30;
    uStack_1b0 = uStack_760;
    local_148 = in_stack_fffffffffffff368;
    lStack_140 = in_stack_fffffffffffff370;
  }
  for (uVar13 = 0; uVar13 < 3; uVar13 = uVar13 + 1) {
    cn_implode_scratchpad<false>(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
    keccakf((uint64_t *)local_988[uVar13],0x18);
    (*extra_hashes[(int)(*(byte *)local_988[uVar13] & 3)])
              ((uint8_t *)local_988[uVar13],200,(uint8_t *)(local_980 + uVar13 * 0x20));
  }
  return;
}

Assistant:

inline void cryptonight_triple_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 3; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
    }

    for (size_t i = 0; i < 3; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}